

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  unsigned_long *puVar1;
  Header *pHVar2;
  Iterator __end1;
  Header *pHVar3;
  char *target;
  size_t sVar4;
  StringPtr *pSVar5;
  unsigned_long i_1;
  ulong uVar6;
  size_t size;
  long lVar7;
  ulong uVar8;
  char *ptr;
  Fault f;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  StringPtr newline;
  StringPtr colon;
  StringPtr space;
  ArrayPtr<const_char> word2_local;
  ArrayPtr<const_char> word1_local;
  
  word2_local.size_ = word2.size_;
  word2_local.ptr = word2.ptr;
  sVar4 = word1.size_;
  word1_local.ptr = word1.ptr;
  space.content.ptr = " ";
  space.content.size_ = 2;
  newline.content.ptr = "\r\n";
  newline.content.size_ = 3;
  colon.content.ptr = ": ";
  colon.content.size_ = 3;
  _kjCondition.right = (this->indexedHeaders).size_;
  _kjCondition.left = connectionHeaders.size_;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = connectionHeaders.size_ <= _kjCondition.right;
  word1_local.size_ = sVar4;
  if (_kjCondition.right < connectionHeaders.size_) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x441,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","_kjCondition,",
               &_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  size = 2;
  if (sVar4 != 0) {
    size = word3.size_ + 6 + word2_local.size_ + sVar4;
  }
  lVar7 = 8;
  for (uVar8 = 0; _kjCondition.right != uVar8; uVar8 = uVar8 + 1) {
    pSVar5 = (this->indexedHeaders).ptr;
    if (uVar8 < connectionHeaders.size_) {
      pSVar5 = connectionHeaders.ptr;
    }
    uVar6 = *(ulong *)((long)&(pSVar5->content).ptr + lVar7);
    if (1 < uVar6) {
      size = size + uVar6 + (this->table->namesById).builder.ptr[uVar8 & 0xffffffff].content.size_ +
             2;
    }
    lVar7 = lVar7 + 0x10;
  }
  for (pHVar3 = (this->unindexedHeaders).builder.ptr; pHVar3 != (this->unindexedHeaders).builder.pos
      ; pHVar3 = pHVar3 + 1) {
    size = size + (pHVar3->name).content.size_ + (pHVar3->value).content.size_ + 2;
  }
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  if (sVar4 != 0) {
    ptr = target;
    target = kj::_::
             fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                       (target,&word1_local,&space,&word2_local,&space,&word3,&newline);
  }
  uVar8 = (this->indexedHeaders).size_;
  lVar7 = 0;
  ptr = target;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    pSVar5 = connectionHeaders.ptr;
    if (connectionHeaders.size_ <= uVar6) {
      pSVar5 = (this->indexedHeaders).ptr;
    }
    puVar1 = (unsigned_long *)((long)&(pSVar5->content).ptr + lVar7);
    _kjCondition.left = *puVar1;
    _kjCondition.right = puVar1[1];
    if (1 < _kjCondition.right) {
      f.exception = (Exception *)
                    (this->table->namesById).builder.ptr[uVar6 & 0xffffffff].content.ptr;
      target = kj::_::fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr&,kj::StringPtr_const&>
                         (target,(StringPtr *)&f,&colon,(StringPtr *)&_kjCondition,&newline);
      ptr = target;
    }
    lVar7 = lVar7 + 0x10;
  }
  pHVar2 = (this->unindexedHeaders).builder.pos;
  for (pHVar3 = (this->unindexedHeaders).builder.ptr; pHVar3 != pHVar2; pHVar3 = pHVar3 + 1) {
    target = kj::_::
             fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&,kj::StringPtr_const&>
                       (target,&pHVar3->name,&colon,&pHVar3->value,&newline);
    ptr = target;
  }
  ptr = kj::_::fill<kj::StringPtr>(target,&newline);
  _kjCondition.left = (unsigned_long)&ptr;
  sVar4 = (__return_storage_ptr__->content).size_;
  _kjCondition.right = (unsigned_long)((__return_storage_ptr__->content).ptr + (sVar4 - 1));
  if (sVar4 == 0) {
    _kjCondition.right = 0;
  }
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = ptr == (char *)_kjCondition.right;
  if (_kjCondition.result) {
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x45d,FAILED,"ptr == result.end()","_kjCondition,",
             (DebugComparison<char_*&,_char_*> *)&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}